

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall soplex::SPxLPBase<double>::SPxLPBase(SPxLPBase<double> *this,SPxLPBase<double> *old)

{
  SPxOut *pSVar1;
  
  LPRowSetBase<double>::LPRowSetBase
            (&this->super_LPRowSetBase<double>,&old->super_LPRowSetBase<double>);
  LPColSetBase<double>::LPColSetBase
            (&this->super_LPColSetBase<double>,&old->super_LPColSetBase<double>);
  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxLPBase_006aaa60;
  (this->super_LPColSetBase<double>).super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxLPBase_006aad00;
  this->thesense = old->thesense;
  this->offset = old->offset;
  this->_isScaled = old->_isScaled;
  pSVar1 = old->spxout;
  this->lp_scaler = old->lp_scaler;
  this->spxout = pSVar1;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(old->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

SPxLPBase(const SPxLPBase<R>& old)
      : LPRowSetBase<R>(old)
      , LPColSetBase<R>(old)
      , thesense(old.thesense)
      , offset(old.offset)
      , _isScaled(old._isScaled)
      , lp_scaler(old.lp_scaler)
      , spxout(old.spxout)
   {
      _tolerances = old._tolerances;
      assert(isConsistent());
   }